

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_cbc.c
# Opt level: O3

void beltCBCStepD(void *buf,size_t count,void *state)

{
  ulong uVar1;
  
  if (0x1f < count || count == 0x10) {
    uVar1 = count - 0x10;
    do {
      count = uVar1;
      *(ulong *)((long)state + 0x30) = *buf;
      *(ulong *)((long)state + 0x38) = *(ulong *)((long)buf + 8);
      beltBlockDecr((octet *)buf,(u32 *)state);
      *(ulong *)buf = *buf ^ *(ulong *)((long)state + 0x20);
      *(ulong *)((long)buf + 8) = *(ulong *)((long)buf + 8) ^ *(ulong *)((long)state + 0x28);
      *(undefined8 *)((long)state + 0x20) = *(undefined8 *)((long)state + 0x30);
      *(undefined8 *)((long)state + 0x28) = *(undefined8 *)((long)state + 0x38);
      buf = (void *)((long)buf + 0x10);
      uVar1 = count - 0x10;
    } while (count == 0x10 || 0x1f < count);
  }
  if (count != 0) {
    beltBlockDecr((octet *)buf,(u32 *)state);
    memSwap(buf,(ulong *)((long)buf + 0x10),count - 0x10);
    memXor2((ulong *)((long)buf + 0x10),buf,count - 0x10);
    beltBlockDecr((octet *)buf,(u32 *)state);
    *(ulong *)buf = *buf ^ *(ulong *)((long)state + 0x20);
    *(ulong *)((long)buf + 8) = *(ulong *)((long)buf + 8) ^ *(ulong *)((long)state + 0x28);
  }
  return;
}

Assistant:

void beltCBCStepD(void* buf, size_t count, void* state)
{
	belt_cbc_st* st = (belt_cbc_st*)state;
	ASSERT(count >= 16);
	ASSERT(memIsDisjoint2(buf, count, state, beltCBC_keep()));
	// цикл по полным блокам
	while(count >= 32 || count == 16)
	{
		beltBlockCopy(st->block2, buf);
		beltBlockDecr(buf, st->key);
		beltBlockXor2(buf, st->block);
		beltBlockCopy(st->block, st->block2);
		buf = (octet*)buf + 16;
		count -= 16;
	}
	// неполный блок? кража блока
	if (count)
	{
		ASSERT(16 < count && count < 32);
		beltBlockDecr(buf, st->key);
		memSwap(buf, (octet*)buf + 16, count - 16);
		memXor2((octet*)buf + 16, buf, count - 16);
		beltBlockDecr(buf, st->key);
		beltBlockXor2(buf, st->block);
	}
}